

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

int __thiscall SimpleLogger::getLogLevel(SimpleLogger *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(in_RDI + 0x244);
}

Assistant:

inline int getLogLevel()  const { return curLogLevel.load(MOR); }